

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool GlobOpt::DoInlineArgsOpt(Func *func)

{
  uint uVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  JITTimeFunctionBody *this;
  FunctionJITTimeInfo *this_00;
  
  pFVar2 = func->topFunc;
  if (pFVar2 == func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d96,"(topFunc != func)","topFunc != func");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this = JITTimeWorkItem::GetJITFunctionBody(pFVar2->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(pFVar2->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,InlineArgsOptPhase,sourceContextId,functionId);
  if ((bVar4) || (uVar1 = *(uint *)&func->field_0x240, ((uVar1 >> 10 | uVar1) & 1) != 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = (bool)((byte)(uVar1 >> 0xb) & 1);
  }
  return bVar4;
}

Assistant:

bool
GlobOpt::DoInlineArgsOpt(Func const * func)
{
    Func const * topFunc = func->GetTopFunc();
    Assert(topFunc != func);
    bool doInlineArgsOpt =
        !PHASE_OFF(Js::InlineArgsOptPhase, topFunc) &&
        !func->GetHasCalls() &&
        !func->GetHasUnoptimizedArgumentsAccess() &&
        func->m_canDoInlineArgsOpt;
    return doInlineArgsOpt;
}